

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandlerBase.hpp
# Opt level: O0

void __thiscall xercesc_4_0::HandlerBase::HandlerBase(HandlerBase *this)

{
  HandlerBase *this_local;
  
  EntityResolver::EntityResolver(&this->super_EntityResolver);
  DTDHandler::DTDHandler(&this->super_DTDHandler);
  DocumentHandler::DocumentHandler(&this->super_DocumentHandler);
  ErrorHandler::ErrorHandler(&this->super_ErrorHandler);
  (this->super_EntityResolver)._vptr_EntityResolver = (_func_int **)&PTR__HandlerBase_0010a828;
  (this->super_DTDHandler)._vptr_DTDHandler = (_func_int **)&PTR__HandlerBase_0010a8d0;
  (this->super_DocumentHandler)._vptr_DocumentHandler = (_func_int **)&PTR__HandlerBase_0010a908;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&PTR__HandlerBase_0010a970;
  return;
}

Assistant:

HandlerBase() {}